

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzdecomp.cpp
# Opt level: O0

lzham_decompress_state_ptr
lzham::lzham_lib_decompress_reinit(lzham_decompress_state_ptr p,lzham_decompress_params *pParams)

{
  bool bVar1;
  uint uVar2;
  uchar *puVar3;
  lzham_decompress_params *in_RSI;
  lzham_decompressor *in_RDI;
  void *unaff_retaddr;
  uint8 *pNew_dict;
  uint32 new_dict_size;
  lzham_decompressor *pState;
  void *in_stack_ffffffffffffffc8;
  lzham_decompressor *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  lzham_decompressor *pActual_size;
  size_t in_stack_fffffffffffffff8;
  
  if (in_RDI == (lzham_decompressor *)0x0) {
    in_RDI = (lzham_decompressor *)
             lzham_lib_decompress_init
                       ((lzham_decompress_params *)
                        CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  }
  else {
    pActual_size = in_RDI;
    bVar1 = check_params(in_RSI);
    if (bVar1) {
      if (((in_RDI->m_params).m_decompress_flags & 1) == 0) {
        uVar2 = 1 << ((byte)(in_RDI->m_params).m_dict_size_log2 & 0x1f);
        if ((in_RDI->m_pRaw_decomp_buf == (uint8 *)0x0) || (in_RDI->m_raw_decomp_buf_size < uVar2))
        {
          in_stack_ffffffffffffffd0 =
               (lzham_decompressor *)
               lzham_realloc(pNew_dict,unaff_retaddr,in_stack_fffffffffffffff8,
                             (size_t *)pActual_size,SUB81((ulong)in_RSI >> 0x38,0));
          if (in_stack_ffffffffffffffd0 == (lzham_decompressor *)0x0) {
            return (lzham_decompress_state_ptr)0x0;
          }
          in_RDI->m_pRaw_decomp_buf = (uint8 *)in_stack_ffffffffffffffd0;
          in_RDI->m_raw_decomp_buf_size = uVar2;
          puVar3 = math::align_up_pointer<unsigned_char*>(in_RDI->m_pRaw_decomp_buf,0x10);
          in_RDI->m_pDecomp_buf = puVar3;
        }
      }
      else {
        lzham_free(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
        in_RDI->m_pRaw_decomp_buf = (uint8 *)0x0;
        in_RDI->m_raw_decomp_buf_size = 0;
        in_RDI->m_pDecomp_buf = (uint8 *)0x0;
      }
      memcpy(&in_RDI->m_params,in_RSI,0x28);
      lzham_decompressor::init(in_RDI,(EVP_PKEY_CTX *)in_RSI);
      lzham_decompressor::reset_arith_tables(in_stack_ffffffffffffffd0);
    }
    else {
      in_RDI = (lzham_decompressor *)0x0;
    }
  }
  return in_RDI;
}

Assistant:

lzham_decompress_state_ptr LZHAM_CDECL lzham_lib_decompress_reinit(lzham_decompress_state_ptr p, const lzham_decompress_params *pParams)
   {
      if (!p)
         return lzham_lib_decompress_init(pParams);
      
      lzham_decompressor *pState = static_cast<lzham_decompressor *>(p);

      if (!check_params(pParams))
         return NULL;
      
      if (pState->m_params.m_decompress_flags & LZHAM_DECOMP_FLAG_OUTPUT_UNBUFFERED)
      {
         lzham_free(pState->m_malloc_context, pState->m_pRaw_decomp_buf);
         pState->m_pRaw_decomp_buf = NULL;
         pState->m_raw_decomp_buf_size = 0;
         pState->m_pDecomp_buf = NULL;
      }
      else
      {
         uint32 new_dict_size = 1U << pState->m_params.m_dict_size_log2;
         if ((!pState->m_pRaw_decomp_buf) || (pState->m_raw_decomp_buf_size < new_dict_size))
         {
            uint8 *pNew_dict = static_cast<uint8*>(lzham_realloc(pState->m_malloc_context, pState->m_pRaw_decomp_buf, new_dict_size + 15));
            if (!pNew_dict)
               return NULL;
            pState->m_pRaw_decomp_buf = pNew_dict;
            pState->m_raw_decomp_buf_size = new_dict_size;
            pState->m_pDecomp_buf = math::align_up_pointer(pState->m_pRaw_decomp_buf, 16);
         }
      }
      
      pState->m_params = *pParams;

      pState->init();

      pState->reset_arith_tables();
      return pState;
   }